

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O1

void secp256k1_sha256_finalize(secp256k1_sha256 *hash,uchar *out32)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uchar *b32;
  uchar sizedesc [8];
  int iStack_94;
  secp256k1_scalar sStack_90;
  secp256k1_scalar sStack_70;
  uchar local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  char local_19;
  
  uVar1 = hash->bytes;
  uVar4 = (uint)(uVar1 >> 0x3d);
  if (uVar1 >> 0x3d == 0) {
    local_1d = (undefined1)(uVar1 >> 0x1d);
    local_1e = (undefined1)(uVar1 >> 0x25);
    local_1f = (undefined1)(uVar1 >> 0x2d);
    local_20 = (uchar)(uVar1 >> 0x35);
    local_19 = (char)uVar1 * '\b';
    local_1a = (undefined1)(uVar1 >> 5);
    local_1b = (undefined1)(uVar1 >> 0xd);
    local_1c = (undefined1)(uVar1 >> 0x15);
    secp256k1_sha256_write
              (hash,secp256k1_sha256_finalize::pad,(ulong)(0x37U - (int)uVar1 & 0x3f) + 1);
    secp256k1_sha256_write(hash,&local_20,8);
    lVar3 = 0;
    do {
      uVar4 = hash->s[lVar3];
      *(uint *)(out32 + lVar3 * 4) =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      hash->s[lVar3] = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    return;
  }
  secp256k1_sha256_finalize_cold_1();
  iStack_94 = 0;
  if (hash == (secp256k1_sha256 *)0x0) {
    secp256k1_ecdsa_recoverable_signature_parse_compact_cold_4();
  }
  else if ((uint64_t *)out32 != (uint64_t *)0x0) {
    if (b32 == (uchar *)0x0) {
      secp256k1_ecdsa_recoverable_signature_parse_compact_cold_2();
      return;
    }
    if (3 < uVar4) {
      secp256k1_ecdsa_recoverable_signature_parse_compact_cold_1();
      return;
    }
    secp256k1_scalar_set_b32(&sStack_70,b32,&iStack_94);
    iVar2 = iStack_94;
    secp256k1_scalar_set_b32(&sStack_90,b32 + 0x20,&iStack_94);
    if (iVar2 != 0 || iStack_94 != 0) {
      *(uint64_t *)((long)out32 + 0x30) = 0;
      *(uint64_t *)((long)out32 + 0x38) = 0;
      *(uint64_t *)((long)out32 + 0x20) = 0;
      *(uint64_t *)((long)out32 + 0x28) = 0;
      *(uint64_t *)((long)out32 + 0x10) = 0;
      *(uint64_t *)((long)out32 + 0x18) = 0;
      *(uint64_t *)out32 = 0;
      *(uint64_t *)((long)out32 + 8) = 0;
      *(uchar *)((long)out32 + 0x40) = '\0';
      return;
    }
    *(uint64_t *)((long)out32 + 0x10) = sStack_70.d[2];
    *(uint64_t *)((long)out32 + 0x18) = sStack_70.d[3];
    *(uint64_t *)out32 = sStack_70.d[0];
    *(uint64_t *)((long)out32 + 8) = sStack_70.d[1];
    *(uint64_t *)((long)out32 + 0x20) = sStack_90.d[0];
    *(uint64_t *)((long)out32 + 0x28) = sStack_90.d[1];
    *(uint64_t *)((long)out32 + 0x30) = sStack_90.d[2];
    *(uint64_t *)((long)out32 + 0x38) = sStack_90.d[3];
    *(uchar *)((long)out32 + 0x40) = (uchar)uVar4;
    return;
  }
  secp256k1_ecdsa_recoverable_signature_parse_compact_cold_3();
  return;
}

Assistant:

static void secp256k1_sha256_finalize(secp256k1_sha256 *hash, unsigned char *out32) {
    static const unsigned char pad[64] = {0x80};
    unsigned char sizedesc[8];
    int i;
    /* The maximum message size of SHA256 is 2^64-1 bits. */
    VERIFY_CHECK(hash->bytes < ((uint64_t)1 << 61));
    secp256k1_write_be32(&sizedesc[0], hash->bytes >> 29);
    secp256k1_write_be32(&sizedesc[4], hash->bytes << 3);
    secp256k1_sha256_write(hash, pad, 1 + ((119 - (hash->bytes % 64)) % 64));
    secp256k1_sha256_write(hash, sizedesc, 8);
    for (i = 0; i < 8; i++) {
        secp256k1_write_be32(&out32[4*i], hash->s[i]);
        hash->s[i] = 0;
    }
}